

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_generalized_cepstrum_to_mel_generalized_cepstrum.h
# Opt level: O2

void __thiscall sptk::MelGeneralizedCepstrumToMelGeneralizedCepstrum::Buffer::~Buffer(Buffer *this)

{
  ~Buffer(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Buffer() {
    }